

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::DumpStackTrace
               (JavascriptExceptionContext *exceptionContext,bool isThrownException)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 byteCodeOffset;
  StackTrace *pSVar4;
  FunctionBody *pFVar5;
  Utf8SourceInfo *this;
  LPCWSTR pWVar6;
  uint local_38;
  ULONG local_34;
  LONG characterPosition;
  ULONG lineNumber;
  StackFrame *currFrame;
  StackTrace *pSStack_20;
  int i;
  StackTrace *stackTrace;
  JavascriptExceptionContext *pJStack_10;
  bool isThrownException_local;
  JavascriptExceptionContext *exceptionContext_local;
  
  stackTrace._7_1_ = isThrownException;
  pJStack_10 = exceptionContext;
  pSVar4 = JavascriptExceptionContext::GetStackTrace(exceptionContext);
  if (((pSVar4 != (StackTrace *)0x0) &&
      (bVar2 = Phases::IsEnabled((Phases *)&DAT_01ea1258,ExceptionStackTracePhase), bVar2)) &&
     ((stackTrace._7_1_ & 1) != 0)) {
    Output::Print(L"\nStack trace for thrown exception\n");
    pSStack_20 = JavascriptExceptionContext::GetStackTrace(pJStack_10);
    for (currFrame._4_4_ = 0; uVar1 = currFrame._4_4_,
        iVar3 = JsUtil::
                ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                ::Count(&pSStack_20->
                         super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                       ), (int)uVar1 < iVar3; currFrame._4_4_ = currFrame._4_4_ + 1) {
      _characterPosition =
           JsUtil::
           List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(pSStack_20,currFrame._4_4_);
      local_34 = 0;
      local_38 = 0;
      bVar2 = JavascriptExceptionContext::StackFrame::IsScriptFunction(_characterPosition);
      if (bVar2) {
        pFVar5 = JavascriptExceptionContext::StackFrame::GetFunctionBody(_characterPosition);
        this = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFVar5);
        bVar2 = Utf8SourceInfo::GetIsLibraryCode(this);
        if (!bVar2) {
          pFVar5 = JavascriptExceptionContext::StackFrame::GetFunctionBody(_characterPosition);
          byteCodeOffset =
               JavascriptExceptionContext::StackFrame::GetByteCodeOffset(_characterPosition);
          FunctionBody::GetLineCharOffset(pFVar5,byteCodeOffset,&local_34,(LONG *)&local_38,true);
        }
      }
      uVar1 = currFrame._4_4_;
      pWVar6 = JavascriptExceptionContext::StackFrame::GetFunctionName(_characterPosition);
      Output::Print(L"    %3d: %s (%d, %d)\n",(ulong)uVar1,pWVar6,(ulong)local_34,(ulong)local_38);
    }
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptExceptionOperators::DumpStackTrace(JavascriptExceptionContext& exceptionContext, bool isThrownException)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (! exceptionContext.GetStackTrace()
            || ! Configuration::Global.flags.Dump.IsEnabled(ExceptionStackTracePhase)
            || ! isThrownException)
        {
            return;
        }
        Output::Print(_u("\nStack trace for thrown exception\n"));

        JavascriptExceptionContext::StackTrace *stackTrace = exceptionContext.GetStackTrace();
        for (int i=0; i < stackTrace->Count(); i++)
        {
            Js::JavascriptExceptionContext::StackFrame& currFrame = stackTrace->Item(i);
            ULONG lineNumber = 0;
            LONG characterPosition = 0;
            if (currFrame.IsScriptFunction() && !currFrame.GetFunctionBody()->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                currFrame.GetFunctionBody()->GetLineCharOffset(currFrame.GetByteCodeOffset(), &lineNumber, &characterPosition);
            }
            Output::Print(_u("    %3d: %s (%d, %d)\n"), i, currFrame.GetFunctionName(), lineNumber, characterPosition);
        }
        Output::Flush();
#endif
    }